

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filepath_tests.cpp
# Opt level: O0

void __thiscall iu_FilePath_x_iutest_x_PrintTo_Test::Body(iu_FilePath_x_iutest_x_PrintTo_Test *this)

{
  bool bVar1;
  char *message;
  type **in_stack_fffffffffffffd98;
  AssertionHelper local_240;
  Fixed local_210;
  string local_88;
  undefined1 local_68 [8];
  AssertionResult iutest_ar;
  undefined1 local_30 [8];
  FilePath path;
  iu_FilePath_x_iutest_x_PrintTo_Test *this_local;
  
  path.m_path.field_2._8_8_ = this;
  iutest::detail::iuFilePath::iuFilePath((iuFilePath *)local_30,"test.exe");
  iutest::detail::AlwaysZero();
  iutest::PrintToString<iutest::detail::iuFilePath>(&local_88,(iuFilePath *)local_30);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            ((AssertionResult *)local_68,(internal *)"\"test.exe\"","::iutest::PrintToString(path)",
             "test.exe",(char *)&local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffd98);
  std::__cxx11::string::~string((string *)&local_88);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    memset(&local_210,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_210);
    message = iutest::AssertionResult::message((AssertionResult *)local_68);
    iutest::AssertionHelper::AssertionHelper
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0xeb,message,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_240,&local_210);
    iutest::AssertionHelper::~AssertionHelper(&local_240);
    iutest::AssertionHelper::Fixed::~Fixed(&local_210);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  iutest::detail::iuFilePath::~iuFilePath((iuFilePath *)local_30);
  return;
}

Assistant:

IUTEST(FilePath, PrintTo)
{
    ::iutest::internal::FilePath path("test.exe");
    IUTEST_ASSERT_STREQ("test.exe", ::iutest::PrintToString(path));
}